

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Host.cpp
# Opt level: O3

int computeHostNumPhysicalCores(void)

{
  undefined4 uVar1;
  bool bVar2;
  raw_ostream *prVar3;
  long *plVar4;
  size_t in_RCX;
  int iVar5;
  int iVar6;
  StringRef *this;
  size_t sVar7;
  int iVar8;
  longlong *Result;
  long lVar9;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Chars;
  StringRef Chars_00;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Separator;
  StringRef SVar10;
  StringRef SVar11;
  longlong LLVal;
  ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_> Text;
  pair<llvm::StringRef,_llvm::StringRef> Data;
  SmallVector<llvm::StringRef,_8U> strs;
  SmallSet<std::pair<int,_int>,_32U,_std::less<std::pair<int,_int>_>_> UniqueItems;
  pair<int,_int> local_240;
  anon_union_16_2_427f0595_for_ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>_2
  local_238;
  byte local_228;
  pair<llvm::StringRef,_llvm::StringRef> local_220;
  SmallVectorImpl<llvm::StringRef> local_200;
  StringRef local_1f0 [8];
  Child local_170;
  void *local_168;
  Child local_160 [32];
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  local_60;
  
  llvm::Twine::Twine((Twine *)&local_170,"/proc/cpuinfo");
  llvm::MemoryBuffer::getFileAsStream
            ((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
              *)&local_238.TStorage,(Twine *)&local_170);
  uVar1 = local_238._0_4_;
  if ((local_228 & 1) == 0) {
    local_200.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
    super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX = local_1f0;
    local_200.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
    super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = 0;
    local_200.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
    super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity = 8;
    local_170 = (Child)((Child *)(CONCAT44(local_238._4_4_,local_238._0_4_) + 8))->twine;
    local_168 = (void *)(*(long *)(CONCAT44(local_238._4_4_,local_238._0_4_) + 0x10) -
                        (long)local_170);
    iVar8 = -1;
    Result = (longlong *)0xffffffff;
    SVar10.Length = 1;
    SVar10.Data = "\n";
    llvm::StringRef::split((StringRef *)&local_170,&local_200,SVar10,-1,false);
    local_170.twine = (Twine *)local_160;
    local_168 = (void *)0x2000000000;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    iVar6 = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((local_200.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
         super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
        0xffffffff) != 0) {
      lVar9 = (local_200.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
              0xffffffff) << 4;
      iVar6 = -1;
      this = (StringRef *)
             local_200.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
             super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX;
      do {
        SVar11.Length = 6;
        SVar11.Data = " \t\n\v\f\r";
        SVar10 = llvm::StringRef::trim(this,SVar11);
        plVar4 = (long *)SVar10.Data;
        *this = SVar10;
        if (SVar10.Length < 0xb) {
          if (6 < SVar10.Length) {
LAB_001857bc:
            if (*(int *)((long)plVar4 + 3) == 0x64692065 && (int)*plVar4 == 0x65726f63)
            goto LAB_001857d7;
          }
        }
        else {
          if (*(long *)((long)plVar4 + 3) != 0x6469206c61636973 || *plVar4 != 0x6c61636973796870)
          goto LAB_001857bc;
LAB_001857d7:
          local_240.first._0_1_ = 0x3a;
          Separator.Length = 1;
          Separator.Data = (char *)&local_240;
          llvm::StringRef::split(&local_220,this,Separator);
          Chars.Length = 6;
          Chars.Data = " \t\n\v\f\r";
          SVar10 = llvm::StringRef::trim(&local_220.first,Chars);
          plVar4 = (long *)SVar10.Data;
          Chars_00.Length = 6;
          Chars_00.Data = " \t\n\v\f\r";
          SVar11 = llvm::StringRef::trim(&local_220.second,Chars_00);
          if (SVar10.Length == 7) {
            if (*(int *)((long)plVar4 + 3) == 0x64692065 && (int)*plVar4 == 0x65726f63) {
              if (iVar6 != -1) {
                __assert_fail("CurCoreId == -1 && \"Expected a physical id before seeing another core id\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Host.cpp"
                              ,0x45d,"int computeHostNumPhysicalCores()");
              }
              Str_03.Length = 10;
              Str_03.Data = (char *)SVar11.Length;
              bVar2 = llvm::getAsSignedInteger((llvm *)SVar11.Data,Str_03,(uint)&local_240,Result);
              iVar5 = local_240.first;
              if ((pair<int,_int>)(long)iVar5 != local_240) {
                iVar5 = -1;
              }
              iVar6 = -1;
              if (!bVar2) {
                iVar6 = iVar5;
              }
            }
          }
          else if ((SVar10.Length == 0xb) &&
                  (*(long *)((long)plVar4 + 3) == 0x6469206c61636973 &&
                   *plVar4 == 0x6c61636973796870)) {
            if (iVar8 != -1) {
              __assert_fail("CurPhysicalId == -1 && \"Expected a core id before seeing another physical id\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Host.cpp"
                            ,0x458,"int computeHostNumPhysicalCores()");
            }
            Str_02.Length = 10;
            Str_02.Data = (char *)SVar11.Length;
            bVar2 = llvm::getAsSignedInteger((llvm *)SVar11.Data,Str_02,(uint)&local_240,Result);
            iVar5 = local_240.first;
            if ((pair<int,_int>)(long)iVar5 != local_240) {
              iVar5 = -1;
            }
            iVar8 = -1;
            if (!bVar2) {
              iVar8 = iVar5;
            }
          }
          if ((iVar8 != -1) && (iVar6 != -1)) {
            local_240.second = iVar6;
            local_240.first = iVar8;
            llvm::SmallSet<std::pair<int,_int>,_32U,_std::less<std::pair<int,_int>_>_>::insert
                      ((SmallSet<std::pair<int,_int>,_32U,_std::less<std::pair<int,_int>_>_> *)
                       &local_170,&local_240);
            iVar6 = -1;
            iVar8 = -1;
          }
        }
        this = this + 1;
        lVar9 = lVar9 + -0x10;
      } while (lVar9 != 0);
      sVar7 = local_60._M_impl.super__Rb_tree_header._M_node_count;
      if (local_60._M_impl.super__Rb_tree_header._M_node_count == 0) {
        sVar7 = (ulong)local_168 & 0xffffffff;
      }
      iVar6 = (int)sVar7;
    }
    std::
    _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
    if (&(local_170.twine)->LHS != local_160) {
      free(local_170.twine);
    }
    if ((StringRef *)
        local_200.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
        super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX !=
        local_1f0) {
      free(local_200.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX);
    }
  }
  else {
    if (local_238._0_4_ == 0) {
      local_200.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX =
           local_1f0;
      local_200.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = 0;
      local_200.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity = 8;
      __assert_fail("!HasError && \"Cannot get value when an error exists!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/ErrorOr.h"
                    ,0xf4,
                    "storage_type *llvm::ErrorOr<std::unique_ptr<llvm::MemoryBuffer>>::getStorage() [T = std::unique_ptr<llvm::MemoryBuffer>]"
                   );
    }
    prVar3 = llvm::errs();
    Str.Length = 0xb;
    Str.Data = "Can\'t read ";
    prVar3 = llvm::raw_ostream::operator<<(prVar3,Str);
    Str_00.Length = 0xf;
    Str_00.Data = "/proc/cpuinfo: ";
    prVar3 = llvm::raw_ostream::operator<<(prVar3,Str_00);
    (**(code **)(*(long *)local_238._8_8_ + 0x20))(&local_170,local_238._8_8_,uVar1);
    prVar3 = (raw_ostream *)llvm::raw_ostream::write(prVar3,local_170.decI,local_168,in_RCX);
    Str_01.Length = 1;
    Str_01.Data = "\n";
    llvm::raw_ostream::operator<<(prVar3,Str_01);
    if (&(local_170.twine)->LHS != local_160) {
      operator_delete(local_170.twine,(ulong)((long)&(local_160[0].twine)->LHS + 1));
    }
    iVar6 = -1;
  }
  if (((local_228 & 1) == 0) && ((long *)CONCAT44(local_238._4_4_,local_238._0_4_) != (long *)0x0))
  {
    (**(code **)(*(long *)CONCAT44(local_238._4_4_,local_238._0_4_) + 8))();
  }
  return iVar6;
}

Assistant:

static int computeHostNumPhysicalCores() {
  // Read /proc/cpuinfo as a stream (until EOF reached). It cannot be
  // mmapped because it appears to have 0 size.
  llvm::ErrorOr<std::unique_ptr<llvm::MemoryBuffer>> Text =
      llvm::MemoryBuffer::getFileAsStream("/proc/cpuinfo");
  if (std::error_code EC = Text.getError()) {
    llvm::errs() << "Can't read "
                 << "/proc/cpuinfo: " << EC.message() << "\n";
    return -1;
  }
  SmallVector<StringRef, 8> strs;
  (*Text)->getBuffer().split(strs, "\n", /*MaxSplit=*/-1,
                             /*KeepEmpty=*/false);
  int CurPhysicalId = -1;
  int CurCoreId = -1;
  SmallSet<std::pair<int, int>, 32> UniqueItems;
  for (auto &Line : strs) {
    Line = Line.trim();
    if (!Line.startswith("physical id") && !Line.startswith("core id"))
      continue;
    std::pair<StringRef, StringRef> Data = Line.split(':');
    auto Name = Data.first.trim();
    auto Val = Data.second.trim();
    if (Name == "physical id") {
      assert(CurPhysicalId == -1 &&
             "Expected a core id before seeing another physical id");
      Val.getAsInteger(10, CurPhysicalId);
    }
    if (Name == "core id") {
      assert(CurCoreId == -1 &&
             "Expected a physical id before seeing another core id");
      Val.getAsInteger(10, CurCoreId);
    }
    if (CurPhysicalId != -1 && CurCoreId != -1) {
      UniqueItems.insert(std::make_pair(CurPhysicalId, CurCoreId));
      CurPhysicalId = -1;
      CurCoreId = -1;
    }
  }
  return UniqueItems.size();
}